

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::ReadNodeChannels(BVHLoader *this,Node *pNode)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_> *this_00;
  float fVar4;
  string channelToken;
  string local_1e8;
  string local_1c8;
  ChannelType local_1a8 [94];
  
  fVar4 = GetNextTokenAsFloat(this);
  uVar3 = (ulong)fVar4;
  if ((int)uVar3 != 0) {
    this_00 = &pNode->mChannels;
    do {
      GetNextToken_abi_cxx11_(&local_1e8,this);
      iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
      if (iVar1 == 0) {
        local_1a8[0] = Channel_PositionX;
        std::vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
        ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
        if (iVar1 == 0) {
          local_1a8[0] = Channel_PositionY;
          std::
          vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>::
          emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
          if (iVar1 == 0) {
            local_1a8[0] = Channel_PositionZ;
            std::
            vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
            ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
            if (iVar1 == 0) {
              local_1a8[0] = Channel_RotationX;
              std::
              vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
              ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
              if (iVar1 == 0) {
                local_1a8[0] = Channel_RotationY;
                std::
                vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
                if (iVar1 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Invalid channel specifier \"",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                             local_1e8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
                  std::__cxx11::stringbuf::str();
                  ThrowException(this,&local_1c8);
                }
                local_1a8[0] = Channel_RotationZ;
                std::
                vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void BVHLoader::ReadNodeChannels( BVHLoader::Node& pNode)
{
    // number of channels. Use the float reader because we're lazy
    float numChannelsFloat = GetNextTokenAsFloat();
    unsigned int numChannels = (unsigned int) numChannelsFloat;

    for( unsigned int a = 0; a < numChannels; a++)
    {
        std::string channelToken = GetNextToken();

        if( channelToken == "Xposition")
            pNode.mChannels.push_back( Channel_PositionX);
        else if( channelToken == "Yposition")
            pNode.mChannels.push_back( Channel_PositionY);
        else if( channelToken == "Zposition")
            pNode.mChannels.push_back( Channel_PositionZ);
        else if( channelToken == "Xrotation")
            pNode.mChannels.push_back( Channel_RotationX);
        else if( channelToken == "Yrotation")
            pNode.mChannels.push_back( Channel_RotationY);
        else if( channelToken == "Zrotation")
            pNode.mChannels.push_back( Channel_RotationZ);
        else
            ThrowException( format() << "Invalid channel specifier \"" << channelToken << "\"." );
    }
}